

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O0

void __thiscall
DConversationMenu::DConversationMenu(DConversationMenu *this,FStrifeDialogueNode *CurNode)

{
  int iVar1;
  FFont *font;
  FString FVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *name;
  FBrokenLines *pFVar6;
  FStrifeDialogueItemCheck *pFVar7;
  FString local_a0;
  uint local_94;
  char *local_90;
  char *goodbyestr;
  char goodbye [25];
  uint local_64;
  FBrokenLines *local_60;
  FBrokenLines *ReplyLines;
  FString ReplyString;
  char *ReplyText;
  int j;
  int i;
  FStrifeDialogueReply *reply;
  FString dlgtext;
  char *toSay;
  FStrifeDialogueNode *CurNode_local;
  DConversationMenu *this_local;
  
  DMenu::DMenu(&this->super_DMenu,(DMenu *)0x0);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b6c8d0;
  FString::FString(&this->mSpeaker);
  TArray<FString,_FString>::TArray(&this->mResponseLines);
  TArray<unsigned_int,_unsigned_int>::TArray(&this->mResponses);
  this->mCurNode = CurNode;
  this->mDialogueLines = (FBrokenLines *)0x0;
  this->mShowGold = false;
  dlgtext.Chars = CurNode->Dialogue;
  iVar3 = strncmp(dlgtext.Chars,"RANDOM_",7);
  if (iVar3 == 0) {
    FString::FString((FString *)&reply);
    FVar2 = dlgtext;
    iVar3 = FRandom::operator()(&pr_randomspeech);
    FString::Format((FString *)&reply,"TXT_%s_%02d",FVar2.Chars,
                    (ulong)(uint)(iVar3 + 1 + (iVar3 / 10) * -10));
    name = FString::operator_cast_to_char_((FString *)&reply);
    dlgtext.Chars = FStringTable::operator[](&GStrings,name);
    if (dlgtext.Chars == (char *)0x0) {
      dlgtext.Chars = FStringTable::operator[](&GStrings,"TXT_GOAWAY");
    }
    FString::~FString((FString *)&reply);
  }
  else if (*dlgtext.Chars == '$') {
    dlgtext.Chars = FStringTable::operator()(&GStrings,dlgtext.Chars + 1);
  }
  font = SmallFont;
  if (dlgtext.Chars == (char *)0x0) {
    dlgtext.Chars = ".";
  }
  iVar3 = DCanvas::GetWidth((DCanvas *)screen);
  pFVar6 = V_BreakLines(font,iVar3 / CleanXfac + -0x30,dlgtext.Chars,false);
  this->mDialogueLines = pFVar6;
  for (_j = CurNode->Children; _j != (FStrifeDialogueReply *)0x0; _j = _j->Next) {
    if (_j->Reply != (char *)0x0) {
      this->mShowGold = (this->mShowGold & 1U) != 0 || (_j->NeedsGold & 1U) != 0;
      ReplyString.Chars = _j->Reply;
      if (*ReplyString.Chars == '$') {
        ReplyString.Chars = FStringTable::operator()(&GStrings,ReplyString.Chars + 1);
      }
      FString::FString((FString *)&ReplyLines,ReplyString.Chars);
      if ((_j->NeedsGold & 1U) != 0) {
        pFVar7 = TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::operator[]
                           (&_j->ItemCheck,0);
        FString::AppendFormat((FString *)&ReplyLines," for %u",(ulong)(uint)pFVar7->Amount);
      }
      local_60 = V_BreakLines(SmallFont,0x104,(FString *)&ReplyLines,false);
      local_64 = TArray<FString,_FString>::Size(&this->mResponseLines);
      TArray<unsigned_int,_unsigned_int>::Push(&this->mResponses,&local_64);
      ReplyText._0_4_ = 0;
      while (-1 < local_60[(int)ReplyText].Width) {
        TArray<FString,_FString>::Push(&this->mResponseLines,&local_60[(int)ReplyText].Text);
        ReplyText._0_4_ = (int)ReplyText + 1;
      }
      V_FreeBrokenLines(local_60);
      FString::~FString((FString *)&ReplyLines);
    }
  }
  iVar3 = FRandom::operator()(&pr_randomspeech);
  mysnprintf((char *)&goodbyestr,0x19,"TXT_RANDOMGOODBYE_%d",
             (ulong)(uint)(iVar3 + 1 + (iVar3 / 3) * -3));
  local_90 = FStringTable::operator[](&GStrings,(char *)&goodbyestr);
  if (local_90 == (char *)0x0) {
    local_90 = "Bye.";
  }
  local_94 = TArray<FString,_FString>::Size(&this->mResponseLines);
  TArray<unsigned_int,_unsigned_int>::Push(&this->mResponses,&local_94);
  FString::FString(&local_a0,local_90);
  TArray<FString,_FString>::Push(&this->mResponseLines,&local_a0);
  FString::~FString(&local_a0);
  iVar3 = OptionSettings.mLinespacing;
  uVar4 = TArray<FString,_FString>::Size(&this->mResponseLines);
  iVar3 = MIN<int>(0x8c,0xc0 - uVar4 * iVar3);
  this->mYpos = iVar3;
  ReplyText._4_4_ = 0;
  while (-1 < this->mDialogueLines[ReplyText._4_4_].Width) {
    ReplyText._4_4_ = ReplyText._4_4_ + 1;
  }
  iVar1 = ReplyText._4_4_ * 10 + 0x2c;
  iVar3 = this->mYpos;
  iVar5 = DCanvas::GetHeight((DCanvas *)screen);
  if (iVar3 + -100 <
      iVar1 - (int)((long)((ulong)(uint)((int)((long)iVar5 / (long)CleanYfac) >> 0x1f) << 0x20 |
                          (long)iVar5 / (long)CleanYfac & 0xffffffffU) / 2)) {
    iVar3 = DCanvas::GetHeight((DCanvas *)screen);
    this->mYpos = (iVar1 - (int)((long)((ulong)(uint)((int)((long)iVar3 / (long)CleanYfac) >> 0x1f)
                                        << 0x20 | (long)iVar3 / (long)CleanYfac & 0xffffffffU) / 2))
                  + 100;
  }
  ConversationMenuY = this->mYpos;
  return;
}

Assistant:

DConversationMenu(FStrifeDialogueNode *CurNode) 
	{
		mCurNode = CurNode;
		mDialogueLines = NULL;
		mShowGold = false;

		// Format the speaker's message.
		const char * toSay = CurNode->Dialogue;
		if (strncmp (toSay, "RANDOM_", 7) == 0)
		{
			FString dlgtext;

			dlgtext.Format("TXT_%s_%02d", toSay, 1+(pr_randomspeech() % NUM_RANDOM_LINES));
			toSay = GStrings[dlgtext];
			if (toSay == NULL)
			{
				toSay = GStrings["TXT_GOAWAY"];	// Ok, it's lame - but it doesn't look like an error to the player. ;)
			}
		}
		else
		{
			// handle string table replacement
			if (toSay[0] == '$')
			{
				toSay = GStrings(toSay + 1);
			}
		}
		if (toSay == NULL)
		{
			toSay = ".";
		}
		mDialogueLines = V_BreakLines (SmallFont, screen->GetWidth()/CleanXfac - 24*2, toSay);

		FStrifeDialogueReply *reply;
		int i,j;
		for (reply = CurNode->Children, i = 1; reply != NULL; reply = reply->Next)
		{
			if (reply->Reply == NULL)
			{
				continue;
			}
			mShowGold |= reply->NeedsGold;

			const char *ReplyText = reply->Reply;
			if (ReplyText[0] == '$')
			{
				ReplyText = GStrings(ReplyText + 1);
			}
			FString ReplyString = ReplyText;
			if (reply->NeedsGold) ReplyString.AppendFormat(" for %u", reply->ItemCheck[0].Amount);

			FBrokenLines *ReplyLines = V_BreakLines (SmallFont, 320-50-10, ReplyString);

			mResponses.Push(mResponseLines.Size());
			for (j = 0; ReplyLines[j].Width >= 0; ++j)
			{
				mResponseLines.Push(ReplyLines[j].Text);
			}
			++i;
			V_FreeBrokenLines (ReplyLines);
		}
		char goodbye[25];
		mysnprintf(goodbye, countof(goodbye), "TXT_RANDOMGOODBYE_%d", 1+(pr_randomspeech() % NUM_RANDOM_GOODBYES));
		const char *goodbyestr = GStrings[goodbye];
		if (goodbyestr == NULL) goodbyestr = "Bye.";
		mResponses.Push(mResponseLines.Size());
		mResponseLines.Push(FString(goodbyestr));

		// Determine where the top of the reply list should be positioned.
		i = OptionSettings.mLinespacing;
		mYpos = MIN<int> (140, 192 - mResponseLines.Size() * i);
		for (i = 0; mDialogueLines[i].Width >= 0; ++i)
		{ }
		i = 44 + i * 10;
		if (mYpos - 100 < i - screen->GetHeight() / CleanYfac / 2)
		{
			mYpos = i - screen->GetHeight() / CleanYfac / 2 + 100;
		}
		ConversationMenuY = mYpos;
		//ConversationMenu.indent = 50;
	}